

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O3

void __thiscall jsonnet::internal::anon_unknown_0::Heap::sweep(Heap *this)

{
  pointer ppHVar1;
  pointer ppHVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  this->lastMark = this->lastMark + '\x01';
  ppHVar1 = (this->entities).
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppHVar2 = (this->entities).
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppHVar2 == ppHVar1) {
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    do {
      if (ppHVar1[uVar5]->mark != this->lastMark) {
        (*ppHVar1[uVar5]->_vptr_HeapEntity[1])();
        ppHVar1 = (this->entities).
                  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppHVar2 = (this->entities).
                  super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar3 = (long)ppHVar2 - (long)ppHVar1 >> 3;
        if (uVar5 != lVar3 - 1U) {
          ppHVar1[uVar5] = ppHVar1[lVar3 + -1];
          ppHVar1 = (this->entities).
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppHVar2 = (this->entities).
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        ppHVar2 = ppHVar2 + -1;
        (this->entities).
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppHVar2;
        uVar5 = uVar5 - 1;
      }
      uVar5 = uVar5 + 1;
      uVar4 = (long)ppHVar2 - (long)ppHVar1 >> 3;
    } while (uVar5 < uVar4);
  }
  this->numEntities = uVar4;
  this->lastNumEntities = uVar4;
  return;
}

Assistant:

void sweep(void)
    {
        lastMark++;
        // Heap shrinks during this loop.  Do not cache entities.size().
        for (unsigned long i = 0; i < entities.size(); ++i) {
            HeapEntity *x = entities[i];
            if (x->mark != lastMark) {
                delete x;
                if (i != entities.size() - 1) {
                    // Swap it with the back.
                    entities[i] = entities[entities.size() - 1];
                }
                entities.pop_back();
                --i;
            }
        }
        lastNumEntities = numEntities = entities.size();
    }